

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigs.c
# Opt level: O3

void get_extensions(int sock,int command,int res)

{
  if ((((command - 0x2bU < 0x40) &&
       ((0x8003202149402005U >> ((ulong)(command - 0x2bU) & 0x3f) & 1) != 0)) ||
      ((command - 0x6dU < 6 && ((0x31U >> (command - 0x6dU & 0x1f) & 1) != 0)))) && (0 < res)) {
    recv(sock,response_buf,(ulong)(uint)res,0x100);
    response_buf[(uint)res] = '\0';
  }
  return;
}

Assistant:

void get_extensions(int sock, int command, int res)
{
   switch (command)
   {
      case PI_CMD_BI2CZ:
      case PI_CMD_BSCX:
      case PI_CMD_BSPIX:
      case PI_CMD_CF2:
      case PI_CMD_FL:
      case PI_CMD_FR:
      case PI_CMD_I2CPK:
      case PI_CMD_I2CRD:
      case PI_CMD_I2CRI:
      case PI_CMD_I2CRK:
      case PI_CMD_I2CZ:
      case PI_CMD_PROCP:
      case PI_CMD_SERR:
      case PI_CMD_SLR:
      case PI_CMD_SPIX:
      case PI_CMD_SPIR:

         if (res > 0)
         {
            recv(sock, response_buf, res, MSG_WAITALL);
            response_buf[res] = 0;
         }
         break;
   }
}